

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O3

int Edg_ManEvalEdgeDelayR(Gia_Man_t *p)

{
  ulong uVar1;
  uint uVar2;
  Vec_Wec_t *pVVar3;
  Vec_Int_t *pVVar4;
  bool bVar5;
  int iVar6;
  int *piVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  size_t __size;
  ulong uVar15;
  
  if ((p->vEdge1 == (Vec_Int_t *)0x0) || (p->vEdge2 == (Vec_Int_t *)0x0)) {
    __assert_fail("p->vEdge1 && p->vEdge2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                  ,0x2e0,"int Edg_ManEvalEdgeDelayR(Gia_Man_t *)");
  }
  pVVar8 = p->vEdgeDelayR;
  uVar2 = p->nObjs;
  uVar9 = (ulong)uVar2;
  if (pVVar8 == (Vec_Int_t *)0x0) {
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    uVar13 = 0x10;
    if (0xe < uVar2 - 1) {
      uVar13 = uVar2;
    }
    pVVar8->nCap = uVar13;
    if (uVar13 == 0) {
      pVVar8->pArray = (int *)0x0;
      pVVar8->nSize = uVar2;
    }
    else {
      piVar7 = (int *)malloc((long)(int)uVar13 << 2);
      pVVar8->pArray = piVar7;
      pVVar8->nSize = uVar2;
      if (piVar7 != (int *)0x0) {
        memset(piVar7,0,(long)(int)uVar2 << 2);
      }
    }
    p->vEdgeDelayR = pVVar8;
  }
  else {
    if (pVVar8->nCap < (int)uVar2) {
      __size = (long)(int)uVar2 << 2;
      if (pVVar8->pArray == (int *)0x0) {
        piVar7 = (int *)malloc(__size);
      }
      else {
        piVar7 = (int *)realloc(pVVar8->pArray,__size);
      }
      pVVar8->pArray = piVar7;
      if (piVar7 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar8->nCap = uVar2;
    }
    if (0 < (int)uVar2) {
      memset(pVVar8->pArray,0,uVar9 * 4);
    }
    pVVar8->nSize = uVar2;
    uVar9 = (ulong)(uint)p->nObjs;
  }
  iVar6 = 0;
  if (1 < (int)uVar9) {
    pVVar3 = p->vMapping2;
    iVar6 = 0;
    do {
      if ((long)pVVar3->nSize < (long)uVar9) {
LAB_001fb128:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      uVar1 = uVar9 - 1;
      iVar11 = iVar6;
      if (pVVar3->pArray[uVar1].nSize != 0) {
        if ((long)p->vFanouts2->nSize < (long)uVar9) goto LAB_001fb128;
        pVVar8 = p->vEdgeDelayR;
        pVVar4 = p->vFanouts2->pArray;
        uVar2 = pVVar4[uVar1].nSize;
        uVar12 = 0;
        if (0 < (int)uVar2) {
          uVar12 = (ulong)uVar2;
        }
        if ((long)(int)uVar2 < 1) {
          iVar10 = pVVar8->nSize;
          iVar11 = 0;
        }
        else {
          iVar11 = 0;
          uVar15 = 0;
          do {
            if ((long)(int)uVar2 == uVar15) {
LAB_001fb109:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar14 = pVVar4[uVar1].pArray[uVar15];
            if ((((long)iVar14 < 0) || (iVar10 = pVVar8->nSize, iVar10 <= iVar14)) ||
               ((long)p->vEdge1->nSize < (long)uVar9)) goto LAB_001fb109;
            uVar13 = 0;
            if (p->vEdge1->pArray[uVar1] != iVar14) {
              if ((long)p->vEdge2->nSize < (long)uVar9) goto LAB_001fb109;
              uVar13 = (uint)(p->vEdge2->pArray[uVar1] != iVar14);
            }
            iVar14 = uVar13 + pVVar8->pArray[iVar14];
            if (iVar11 <= iVar14) {
              iVar11 = iVar14;
            }
            uVar15 = uVar15 + 1;
          } while (uVar12 != uVar15);
        }
        if ((long)iVar10 < (long)uVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar8->pArray[uVar1] = iVar11;
        if (iVar11 < iVar6) {
          iVar11 = iVar6;
        }
      }
      iVar6 = iVar11;
      bVar5 = 2 < (long)uVar9;
      uVar9 = uVar1;
    } while (bVar5);
  }
  return iVar6;
}

Assistant:

int Edg_ManEvalEdgeDelayR( Gia_Man_t * p )
{
//    int k, DelayNoEdge = 1;
    int iLut, Delay, DelayMax = 0;
    assert( p->vEdge1 && p->vEdge2 );
    if ( p->vEdgeDelayR == NULL )
        p->vEdgeDelayR = Vec_IntStart( Gia_ManObjNum(p) );
    else
        Vec_IntFill( p->vEdgeDelayR, Gia_ManObjNum(p), 0 );
//    Gia_ManForEachCoDriverId( p, iLut, k )
//        Vec_IntWriteEntry( p->vEdgeDelayR, iLut, DelayNoEdge );
    Gia_ManForEachLut2Reverse( p, iLut )
    {
        Delay = Edg_ObjEvalEdgeDelayR(p, iLut, p->vEdgeDelayR);
        Vec_IntWriteEntry( p->vEdgeDelayR, iLut, Delay );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    return DelayMax;
}